

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_node.hpp
# Opt level: O2

bool jsoncons::jsonpath::operator==(basic_path_node<char> *lhs,basic_path_node<char> *rhs)

{
  path_node_kind pVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar2;
  
  if (lhs->size_ == rhs->size_) {
    bVar2 = true;
    while ((lhs != (basic_path_node<char> *)0x0 && (bVar2 != false))) {
      pVar1 = lhs->node_kind_;
      if (pVar1 == rhs->node_kind_) {
        if (pVar1 < index) {
          __x._M_len = (lhs->name_)._M_len;
          __x._M_str = (lhs->name_)._M_str;
          __y._M_len = (rhs->name_)._M_len;
          __y._M_str = (rhs->name_)._M_str;
          bVar2 = std::operator==(__x,__y);
        }
        else {
          bVar2 = true;
          if (pVar1 == index) {
            bVar2 = lhs->index_ == rhs->index_;
          }
        }
      }
      else {
        bVar2 = false;
      }
      lhs = lhs->parent_;
      rhs = rhs->parent_;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

std::size_t size() const
        {
            return size_;
        }